

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdjs_elements_transaction.cpp
# Opt level: O0

void cfd::js::api::json::ElementsTransactionJsonApi::EstimateFee
               (EstimateFeeRequest *request,EstimateFeeResponse *response)

{
  byte bVar1;
  bool bVar2;
  int iVar3;
  int iVar4;
  JsonObjectVector<cfd::js::api::json::SelectUtxoData,_cfd::js::api::SelectUtxoDataStruct> *pJVar5;
  int64_t iVar6;
  Amount extraout_DL;
  double dVar7;
  undefined4 in_stack_fffffffffffff5fc;
  int64_t local_958;
  int64_t local_950;
  int64_t local_948;
  int64_t local_940;
  _Base_ptr local_938;
  Amount local_930;
  undefined1 local_928 [40];
  Amount fee;
  ElementsTransactionApi local_8f1;
  Amount local_8f0 [7];
  ElementsTransactionApi api;
  Amount utxo_fee;
  Amount local_8e0 [8];
  Amount tx_fee;
  undefined1 local_8d0 [88];
  undefined1 local_878 [32];
  undefined1 local_858 [88];
  undefined1 local_800 [32];
  undefined1 local_7e0 [88];
  undefined1 local_788 [32];
  undefined1 local_768 [32];
  undefined1 local_748 [88];
  undefined1 local_6f0 [32];
  undefined1 local_6d0 [72];
  undefined1 local_688 [32];
  undefined1 local_668 [72];
  ElementsUtxoAndOption data;
  SelectUtxoData *utxo;
  iterator __end3;
  iterator __begin3;
  JsonObjectVector<cfd::js::api::json::SelectUtxoData,_cfd::js::api::SelectUtxoDataStruct> *__range3
  ;
  ConfidentialAssetId local_b0;
  undefined1 local_88 [48];
  undefined1 local_58 [8];
  ConfidentialAssetId fee_asset;
  vector<cfd::api::ElementsUtxoAndOption,_std::allocator<cfd::api::ElementsUtxoAndOption>_> utxos;
  EstimateFeeResponse *response_local;
  EstimateFeeRequest *request_local;
  
  std::vector<cfd::api::ElementsUtxoAndOption,_std::allocator<cfd::api::ElementsUtxoAndOption>_>::
  vector((vector<cfd::api::ElementsUtxoAndOption,_std::allocator<cfd::api::ElementsUtxoAndOption>_>
          *)&fee_asset.version_);
  cfd::core::ConfidentialAssetId::ConfidentialAssetId((ConfidentialAssetId *)local_58);
  EstimateFeeRequest::GetFeeAsset_abi_cxx11_((EstimateFeeRequest *)local_88);
  bVar1 = std::__cxx11::string::empty();
  std::__cxx11::string::~string((string *)local_88);
  if (((bVar1 ^ 0xff) & 1) != 0) {
    EstimateFeeRequest::GetFeeAsset_abi_cxx11_((EstimateFeeRequest *)&__range3);
    cfd::core::ConfidentialAssetId::ConfidentialAssetId(&local_b0,(string *)&__range3);
    cfd::core::ConfidentialAssetId::operator=((ConfidentialAssetId *)local_58,&local_b0);
    core::ConfidentialAssetId::~ConfidentialAssetId(&local_b0);
    std::__cxx11::string::~string((string *)&__range3);
  }
  pJVar5 = EstimateFeeRequest::GetSelectUtxos(request);
  __end3 = std::
           vector<cfd::js::api::json::SelectUtxoData,_std::allocator<cfd::js::api::json::SelectUtxoData>_>
           ::begin(&(pJVar5->super_JsonVector<cfd::js::api::json::SelectUtxoData>).
                    super_vector<cfd::js::api::json::SelectUtxoData,_std::allocator<cfd::js::api::json::SelectUtxoData>_>
                  );
  utxo = (SelectUtxoData *)
         std::
         vector<cfd::js::api::json::SelectUtxoData,_std::allocator<cfd::js::api::json::SelectUtxoData>_>
         ::end(&(pJVar5->super_JsonVector<cfd::js::api::json::SelectUtxoData>).
                super_vector<cfd::js::api::json::SelectUtxoData,_std::allocator<cfd::js::api::json::SelectUtxoData>_>
              );
  while (bVar2 = __gnu_cxx::operator!=
                           (&__end3,(__normal_iterator<cfd::js::api::json::SelectUtxoData_*,_std::vector<cfd::js::api::json::SelectUtxoData,_std::allocator<cfd::js::api::json::SelectUtxoData>_>_>
                                     *)&utxo), bVar2) {
    data._1328_8_ =
         __gnu_cxx::
         __normal_iterator<cfd::js::api::json::SelectUtxoData_*,_std::vector<cfd::js::api::json::SelectUtxoData,_std::allocator<cfd::js::api::json::SelectUtxoData>_>_>
         ::operator*(&__end3);
    memset((ElementsUtxoAndOption *)(local_668 + 0x40),0,0x538);
    cfd::api::ElementsUtxoAndOption::ElementsUtxoAndOption
              ((ElementsUtxoAndOption *)(local_668 + 0x40));
    SelectUtxoData::GetTxid_abi_cxx11_((SelectUtxoData *)local_668);
    cfd::core::Txid::Txid((Txid *)(local_668 + 0x20),(string *)local_668);
    cfd::core::Txid::operator=((Txid *)&data.field_0x20,(Txid *)(local_668 + 0x20));
    core::Txid::~Txid((Txid *)(local_668 + 0x20));
    std::__cxx11::string::~string((string *)local_668);
    data._64_4_ = SelectUtxoData::GetVout((SelectUtxoData *)data._1328_8_);
    SelectUtxoData::GetAsset_abi_cxx11_((SelectUtxoData *)local_688);
    bVar1 = std::__cxx11::string::empty();
    std::__cxx11::string::~string((string *)local_688);
    if (((bVar1 ^ 0xff) & 1) != 0) {
      SelectUtxoData::GetAsset_abi_cxx11_((SelectUtxoData *)local_6d0);
      cfd::core::ConfidentialAssetId::ConfidentialAssetId
                ((ConfidentialAssetId *)(local_6d0 + 0x20),(string *)local_6d0);
      cfd::core::ConfidentialAssetId::operator=
                ((ConfidentialAssetId *)&data.field_0x270,(ConfidentialAssetId *)(local_6d0 + 0x20))
      ;
      core::ConfidentialAssetId::~ConfidentialAssetId((ConfidentialAssetId *)(local_6d0 + 0x20));
      std::__cxx11::string::~string((string *)local_6d0);
    }
    SelectUtxoData::GetRedeemScript_abi_cxx11_((SelectUtxoData *)local_6f0);
    bVar1 = std::__cxx11::string::empty();
    std::__cxx11::string::~string((string *)local_6f0);
    if (((bVar1 ^ 0xff) & 1) != 0) {
      SelectUtxoData::GetRedeemScript_abi_cxx11_((SelectUtxoData *)local_748);
      cfd::core::Script::Script((Script *)(local_748 + 0x20),(string *)local_748);
      cfd::core::Script::operator=((Script *)&data.field_0x80,(Script *)(local_748 + 0x20));
      core::Script::~Script((Script *)(local_748 + 0x20));
      std::__cxx11::string::~string((string *)local_748);
    }
    SelectUtxoData::GetDescriptor_abi_cxx11_((SelectUtxoData *)local_768);
    std::__cxx11::string::operator=((string *)&data.field_0x230,(string *)local_768);
    std::__cxx11::string::~string((string *)local_768);
    data._616_8_ = 0;
    SelectUtxoData::GetScriptSigTemplate_abi_cxx11_((SelectUtxoData *)local_788);
    bVar1 = std::__cxx11::string::empty();
    std::__cxx11::string::~string((string *)local_788);
    if (((bVar1 ^ 0xff) & 1) != 0) {
      SelectUtxoData::GetScriptSigTemplate_abi_cxx11_((SelectUtxoData *)local_7e0);
      cfd::core::Script::Script((Script *)(local_7e0 + 0x20),(string *)local_7e0);
      cfd::core::Script::operator=((Script *)&data.field_0x4b0,(Script *)(local_7e0 + 0x20));
      core::Script::~Script((Script *)(local_7e0 + 0x20));
      std::__cxx11::string::~string((string *)local_7e0);
    }
    data._1256_1_ = SelectUtxoData::GetIsIssuance((SelectUtxoData *)data._1328_8_);
    data._1257_1_ = SelectUtxoData::GetIsBlindIssuance((SelectUtxoData *)data._1328_8_);
    data._1258_1_ = SelectUtxoData::GetIsPegin((SelectUtxoData *)data._1328_8_);
    iVar6 = SelectUtxoData::GetPeginBtcTxSize((SelectUtxoData *)data._1328_8_);
    data._1260_4_ = SUB84(iVar6,0);
    data.claim_script._48_4_ =
         SelectUtxoData::GetPeginTxOutProofSize((SelectUtxoData *)data._1328_8_);
    SelectUtxoData::GetClaimScript_abi_cxx11_((SelectUtxoData *)local_800);
    bVar1 = std::__cxx11::string::empty();
    std::__cxx11::string::~string((string *)local_800);
    if (((bVar1 ^ 0xff) & 1) == 0) {
      SelectUtxoData::GetFedpegScript_abi_cxx11_((SelectUtxoData *)local_878);
      bVar1 = std::__cxx11::string::empty();
      std::__cxx11::string::~string((string *)local_878);
      if (((bVar1 ^ 0xff) & 1) != 0) {
        SelectUtxoData::GetFedpegScript_abi_cxx11_((SelectUtxoData *)local_8d0);
        cfd::core::Script::Script((Script *)(local_8d0 + 0x20),(string *)local_8d0);
        cfd::core::Script::operator=((Script *)&data.is_issuance,(Script *)(local_8d0 + 0x20));
        core::Script::~Script((Script *)(local_8d0 + 0x20));
        std::__cxx11::string::~string((string *)local_8d0);
      }
    }
    else {
      SelectUtxoData::GetClaimScript_abi_cxx11_((SelectUtxoData *)local_858);
      cfd::core::Script::Script((Script *)(local_858 + 0x20),(string *)local_858);
      cfd::core::Script::operator=((Script *)&data.is_issuance,(Script *)(local_858 + 0x20));
      core::Script::~Script((Script *)(local_858 + 0x20));
      std::__cxx11::string::~string((string *)local_858);
    }
    std::vector<cfd::api::ElementsUtxoAndOption,_std::allocator<cfd::api::ElementsUtxoAndOption>_>::
    push_back((vector<cfd::api::ElementsUtxoAndOption,_std::allocator<cfd::api::ElementsUtxoAndOption>_>
               *)&fee_asset.version_,(value_type *)(local_668 + 0x40));
    cfd::api::ElementsUtxoAndOption::~ElementsUtxoAndOption
              ((ElementsUtxoAndOption *)(local_668 + 0x40));
    __gnu_cxx::
    __normal_iterator<cfd::js::api::json::SelectUtxoData_*,_std::vector<cfd::js::api::json::SelectUtxoData,_std::allocator<cfd::js::api::json::SelectUtxoData>_>_>
    ::operator++(&__end3);
  }
  cfd::core::Amount::Amount(local_8e0);
  cfd::core::Amount::Amount(local_8f0);
  cfd::api::ElementsTransactionApi::ElementsTransactionApi(&local_8f1);
  EstimateFeeRequest::GetTx_abi_cxx11_((EstimateFeeRequest *)local_928);
  bVar2 = EstimateFeeRequest::GetIsBlind(request);
  dVar7 = EstimateFeeRequest::GetFeeRate(request);
  iVar3 = EstimateFeeRequest::GetExponent(request);
  iVar4 = EstimateFeeRequest::GetMinimumBits(request);
  local_938 = (_Base_ptr)
              cfd::api::ElementsTransactionApi::EstimateFee
                        ((string *)&local_8f1,(vector *)local_928,
                         (ConfidentialAssetId *)&fee_asset.version_,(Amount *)local_58,local_8e0,
                         SUB81(local_8f0,0),dVar7,(uint)bVar2,iVar3,
                         (uint *)CONCAT44(in_stack_fffffffffffff5fc,iVar4));
  local_930 = extraout_DL;
  local_928._32_8_ = local_938;
  fee = extraout_DL;
  std::__cxx11::string::~string((string *)local_928);
  local_940 = cfd::core::Amount::GetSatoshiValue();
  EstimateFeeResponse::SetFeeAmount(response,&local_940);
  local_948 = cfd::core::Amount::GetSatoshiValue();
  EstimateFeeResponse::SetTxFeeAmount(response,&local_948);
  local_950 = cfd::core::Amount::GetSatoshiValue();
  EstimateFeeResponse::SetTxoutFeeAmount(response,&local_950);
  local_958 = cfd::core::Amount::GetSatoshiValue();
  EstimateFeeResponse::SetUtxoFeeAmount(response,&local_958);
  core::ConfidentialAssetId::~ConfidentialAssetId((ConfidentialAssetId *)local_58);
  std::vector<cfd::api::ElementsUtxoAndOption,_std::allocator<cfd::api::ElementsUtxoAndOption>_>::
  ~vector((vector<cfd::api::ElementsUtxoAndOption,_std::allocator<cfd::api::ElementsUtxoAndOption>_>
           *)&fee_asset.version_);
  return;
}

Assistant:

void ElementsTransactionJsonApi::EstimateFee(
    EstimateFeeRequest* request, EstimateFeeResponse* response) {
  std::vector<ElementsUtxoAndOption> utxos;

  // elements only.
  ConfidentialAssetId fee_asset;
  if (!request->GetFeeAsset().empty()) {
    fee_asset = ConfidentialAssetId(request->GetFeeAsset());
  }

  for (auto& utxo : request->GetSelectUtxos()) {
    ElementsUtxoAndOption data = {};
    data.utxo.txid = Txid(utxo.GetTxid());
    data.utxo.vout = utxo.GetVout();
    if (!utxo.GetAsset().empty()) {
      data.utxo.asset = ConfidentialAssetId(utxo.GetAsset());
    }
    if (!utxo.GetRedeemScript().empty()) {
      data.utxo.redeem_script = Script(utxo.GetRedeemScript());
    }
    data.utxo.descriptor = utxo.GetDescriptor();
    data.utxo.binary_data = nullptr;
    if (!utxo.GetScriptSigTemplate().empty()) {
      data.utxo.scriptsig_template = Script(utxo.GetScriptSigTemplate());
    }

    data.is_issuance = utxo.GetIsIssuance();
    data.is_blind_issuance = utxo.GetIsBlindIssuance();
    data.is_pegin = utxo.GetIsPegin();
    data.pegin_btc_tx_size = utxo.GetPeginBtcTxSize();
    data.pegin_txoutproof_size = utxo.GetPeginTxOutProofSize();
    if (!utxo.GetClaimScript().empty()) {
      data.claim_script = Script(utxo.GetClaimScript());
    } else if (!utxo.GetFedpegScript().empty()) {
      data.claim_script = Script(utxo.GetFedpegScript());
    }
    utxos.push_back(data);
  }

  Amount tx_fee;
  Amount utxo_fee;
  ElementsTransactionApi api;
  Amount fee = api.EstimateFee(
      request->GetTx(), utxos, fee_asset, &tx_fee, &utxo_fee,
      request->GetIsBlind(), request->GetFeeRate(), request->GetExponent(),
      request->GetMinimumBits());

  response->SetFeeAmount(fee.GetSatoshiValue());
  response->SetTxFeeAmount(tx_fee.GetSatoshiValue());
  response->SetTxoutFeeAmount(tx_fee.GetSatoshiValue());
  response->SetUtxoFeeAmount(utxo_fee.GetSatoshiValue());
}